

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
::reset(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
        *this)

{
  vector<char,_std::allocator<char>_> *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::clear();
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x11e09f);
  std::char_traits<char>::to_char_type
            ((int_type *)
             &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x14);
  std::vector<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void reset() noexcept
    {
        token_buffer.clear();
        token_string.clear();
        token_string.push_back(std::char_traits<char_type>::to_char_type(current));
    }